

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_tex.cc
# Opt level: O0

void __thiscall hwtest::pgraph::MthdVtxBeta::emulate_mthd(MthdVtxBeta *this)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  uint local_20;
  uint32_t beta;
  int vid;
  int j;
  uint32_t rclass;
  MthdVtxBeta *this_local;
  
  uVar1 = (uint)(((ulong)(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.access <<
                 0x2f) >> 0x3b);
  beta = 0;
  while (((int)beta < 2 &&
         ((iVar2 = *(int *)&(this->super_SingleMthdTest).super_MthdTest.field_0x25914 * 2 + beta,
          iVar2 != 9 || ((uVar1 & 0xf) != 0xe))))) {
    uVar3 = ((ushort)(((ulong)(this->super_SingleMthdTest).super_MthdTest.val <<
                      (0x30U - (char)(beta << 4) & 0x3f)) >> 0x30) & 0xff80) << 8;
    local_20 = uVar3 | 0x4000;
    if ((uVar3 & 0x800000) != 0) {
      local_20 = uVar3 | 0x1004000;
    }
    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.vtx_beta[iVar2] = local_20;
    beta = beta + 1;
  }
  if ((uVar1 == 0x1d) || (uVar1 == 0x1e)) {
    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.valid[0] =
         1 << ((char)*(undefined4 *)&(this->super_SingleMthdTest).super_MthdTest.field_0x25914 +
               0xcU & 0x1f) |
         (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.valid[0];
  }
  return;
}

Assistant:

void emulate_mthd() override {
		uint32_t rclass = extr(exp.access, 12, 5);
		for (int j = 0; j < 2; j++) {
			int vid = idx * 2 + j;
			if (vid == 9 && (rclass & 0xf) == 0xe)
				break;
			uint32_t beta = extr(val, j*16, 16);
			beta &= 0xff80;
			beta <<= 8;
			beta |= 0x4000;
			if (beta & 1 << 23)
				beta |= 1 << 24;
			exp.vtx_beta[vid] = beta;
		}
		if (rclass == 0x1d || rclass == 0x1e)
			exp.valid[0] |= 1 << (12 + idx);
	}